

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O0

void nn_mutex_init(nn_mutex_t *self)

{
  FILE *pFVar1;
  char *pcVar2;
  pthread_mutexattr_t local_18;
  uint local_14;
  pthread_mutexattr_t attr;
  int rc;
  nn_mutex_t *self_local;
  
  _attr = (pthread_mutex_t *)self;
  pthread_mutexattr_init(&local_18);
  local_14 = pthread_mutexattr_settype(&local_18,2);
  if (local_14 != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    pcVar2 = nn_err_strerror(local_14);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)local_14,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/utils/mutex.c",
            0x46);
    fflush(_stderr);
    nn_err_abort();
  }
  local_14 = pthread_mutex_init(_attr,(pthread_mutexattr_t *)0x0);
  if (local_14 != 0) {
    nn_backtrace_print();
    pFVar1 = _stderr;
    pcVar2 = nn_err_strerror(local_14);
    fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)local_14,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/utils/mutex.c",
            0x48);
    fflush(_stderr);
    nn_err_abort();
  }
  pthread_mutexattr_destroy(&local_18);
  return;
}

Assistant:

void nn_mutex_init (nn_mutex_t *self)
{
    int rc;
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    rc = pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    pthread_mutexattr_destroy(&attr);
}